

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O1

void __thiscall
HdlcAnalyzerResults::GenFcsFieldString
          (HdlcAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  HdlcFcsType HVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  stringstream fieldNameStr;
  char calcFcsStr [128];
  char readFcsStr [128];
  char *local_2e8;
  char *local_2e0;
  char local_2d0 [16];
  stringstream local_2c0 [16];
  long local_2b0 [14];
  ios_base local_240 [264];
  char local_138 [128];
  char local_b8 [136];
  
  HVar1 = this->mSettings->mHdlcFcs;
  if (HVar1 == HDLC_CRC32) {
    local_2e8 = "32";
    uVar5 = 0x20;
  }
  else if (HVar1 == HDLC_CRC16) {
    local_2e8 = "16";
    uVar5 = 0x10;
  }
  else {
    if (HVar1 != HDLC_CRC8) {
      bVar2 = true;
      uVar5 = 0;
      local_2e8 = (char *)0x0;
      goto LAB_0010b43a;
    }
    local_2e8 = "8 ";
    uVar5 = 8;
  }
  bVar2 = false;
LAB_0010b43a:
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x10),display_base,uVar5,local_b8,0x80);
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x18),display_base,uVar5,local_138,0x80);
  std::__cxx11::stringstream::stringstream(local_2c0);
  if ((char)frame[0x21] < '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"!",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"FCS CRC",7);
  if (bVar2) {
    std::ios::clear((int)(ostream *)local_2b0 + (int)*(undefined8 *)(local_2b0[0] + -0x18));
  }
  else {
    sVar3 = strlen(local_2e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_2e8,sVar3);
  }
  if (!tabular) {
    AnalyzerResults::AddResultString
              ((char *)this,"CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_2e0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_2e0 != local_2d0) {
      operator_delete(local_2e0);
    }
  }
  pcVar4 = " ERROR";
  if (-1 < (char)frame[0x21]) {
    pcVar4 = " OK";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2b0,pcVar4,(ulong)((byte)frame[0x21] >> 7) * 3 + 3);
  if (!tabular) {
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_2e0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_2e0 != local_2d0) {
      operator_delete(local_2e0);
    }
  }
  if ((char)frame[0x21] < '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0," - CALC CRC[",0xc);
    sVar3 = strlen(local_138);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_138,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"] != READ CRC[",0xe);
    sVar3 = strlen(local_b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,local_b8,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"]",1);
  }
  if (tabular) {
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddTabularText
              ((char *)this,local_2e0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_2e0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0);
  }
  std::__cxx11::stringstream::~stringstream(local_2c0);
  std::ios_base::~ios_base(local_240);
  return;
}

Assistant:

void HdlcAnalyzerResults::GenFcsFieldString( const Frame& frame, DisplayBase display_base, bool tabular )
{
    U32 fcsBits = 0;
    char* crcTypeStr = 0;
    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
        fcsBits = 8;
        crcTypeStr = "8 ";
        break;
    case HDLC_CRC16:
        fcsBits = 16;
        crcTypeStr = "16";
        break;
    case HDLC_CRC32:
        fcsBits = 32;
        crcTypeStr = "32";
        break;
    }

    char readFcsStr[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, fcsBits, readFcsStr, 128 );
    char calcFcsStr[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData2, display_base, fcsBits, calcFcsStr, 128 );

    stringstream fieldNameStr;
    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << "!";
    }

    fieldNameStr << "FCS CRC" << crcTypeStr;

    if( !tabular )
    {
        AddResultString( "CRC" );
        AddResultString( fieldNameStr.str().c_str() );
    }

    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << " ERROR";
    }
    else
    {
        fieldNameStr << " OK";
    }

    if( !tabular )
    {
        AddResultString( fieldNameStr.str().c_str() );
    }

    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << " - CALC CRC[" << calcFcsStr << "] != READ CRC[" << readFcsStr << "]";
    }

    if( !tabular )
        AddResultString( fieldNameStr.str().c_str() );
    else
        AddTabularText( fieldNameStr.str().c_str() );
}